

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

bool __thiscall
Sudoku::rowCheck(Sudoku *this,
                list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields
                ,bool recordFullFurtherWays,bool debug)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  int i;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  Way local_50;
  list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *local_38;
  
  uVar10 = 0;
  if (this->squared_size_ < 1) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    local_38 = furtherWays_;
    do {
      if (0 < this->squared_size_) {
        i = 1;
        do {
          if (this->squared_size_ < 1) {
            uVar9 = 0;
            bVar4 = true;
          }
          else {
            uVar12 = 0;
            uVar9 = 0;
            iVar7 = 0;
            bVar3 = 0;
            do {
              (*this->_vptr_Sudoku[7])(this,uVar12,(ulong)uVar10);
              iVar6 = (*this->_vptr_Sudoku[7])(this,uVar12,(ulong)uVar10);
              iVar6 = Field::value((testFields->
                                   super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar6].
                                   super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
              if (iVar6 == i) {
                bVar3 = 1;
                bVar4 = false;
              }
              else {
                iVar6 = (*this->_vptr_Sudoku[7])(this,uVar12,(ulong)uVar10);
                bVar4 = Field::valuePossible
                                  ((testFields->
                                   super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar6].
                                   super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i);
                iVar7 = iVar7 + (uint)bVar4;
                if (bVar4) {
                  uVar9 = uVar12;
                }
                bVar4 = iVar7 < 2;
              }
            } while ((bVar4) &&
                    (uVar11 = (int)uVar12 + 1, uVar12 = (ulong)uVar11,
                    (int)uVar11 < this->squared_size_));
            bVar4 = (bool)(iVar7 != 1 | bVar3);
          }
          if (bVar4) {
LAB_0010d51e:
            bVar4 = false;
          }
          else {
            if (debug) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"  Row check (row ",0x11);
              poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"): value ",9);
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,i);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," has to be in field (",0x15);
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)uVar9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar10);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->current_z_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
            }
            p_Var2 = (local_38->
                     super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>).
                     _M_impl._M_node.super__List_node_base._M_prev;
            p_Var1 = p_Var2 + 1;
            *(int *)&p_Var1->_M_next = *(int *)&p_Var1->_M_next + 1;
            local_50.index = (*this->_vptr_Sudoku[7])(this,uVar9,(ulong)uVar10);
            local_50.posZ = this->current_z_;
            local_50.reason = onlyPositionInRow;
            local_50.posX = (int)uVar9;
            local_50.posY = uVar10;
            local_50.value = i;
            std::
            _Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
            ::_M_insert_unique<Sudoku::FurtherWays::Way_const&>
                      ((_Rb_tree<Sudoku::FurtherWays::Way,Sudoku::FurtherWays::Way,std::_Identity<Sudoku::FurtherWays::Way>,std::less<Sudoku::FurtherWays::Way>,std::allocator<Sudoku::FurtherWays::Way>>
                        *)&p_Var2[2]._M_prev,&local_50);
            if (recordFullFurtherWays) goto LAB_0010d51e;
            iVar7 = (*this->_vptr_Sudoku[7])(this,uVar9,(ulong)uVar10);
            Field::setValue((testFields->
                            super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[iVar7].
                            super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,i);
            bVar4 = true;
            bVar5 = true;
          }
        } while ((!bVar4) && (bVar4 = i < this->squared_size_, i = i + 1, bVar4));
      }
    } while ((!bVar5) && (uVar10 = uVar10 + 1, (int)uVar10 < this->squared_size_));
  }
  return bVar5;
}

Assistant:

bool Sudoku::rowCheck(std::list<FurtherWays> &furtherWays_, std::vector<std::shared_ptr<Field>> &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  //check rows, if there are values that can only be at one position
  restart = false;

  // loop over rows
  for (int y = 0; y < squared_size_; y++)
  {
    // loop over all values
    for (int value = 1; value <= squared_size_; value++)
    {
      // check if value is already set (valueIsAlreadySet),
      // or can only be at exactly one position in this row (nPossiblePositionsForValue==1), then it is position positionX
      bool valueIsAlreadySet = false;
      int nPossiblePositionsForValue = 0;
      int positionX = 0;

      // loop over fields in row
      for (int x = 0; x < squared_size_; x++)
      {
        int i = index(x,y);
        int si = testFields.size();
        if(testFields[index(x,y)]->value() == value)
        {
          valueIsAlreadySet = true;
          break;
        }

        if(testFields[index(x,y)]->valuePossible(value))
        {
          nPossiblePositionsForValue++;
          positionX = x;
        }
        if(nPossiblePositionsForValue > 1)
          break;
      }

      //if Value can only be at one position, set it there
      if(nPossiblePositionsForValue == 1 && !valueIsAlreadySet)
      {
        if(debug)
          std::cout<<"  Row check (row "<<y<<"): value "<<value<<" has to be in field ("<<positionX<<","<<y<<","<<current_z_<<")"<<std::endl;

        furtherWays_.back().nRowCheckMatches++;    // increment number of occurences that a value can only be at one position in a row
        furtherWays_.back().addWay(index(positionX,y), positionX, y, current_z_, value, FurtherWays::Reason::onlyPositionInRow);

        if(!recordFullFurtherWays)
        {
          testFields[index(positionX,y)]->setValue(value);
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }
  return restart;
}